

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionEulerAdvancedGeneric::ComputeQuadraticTerms
          (ChBeamSectionEulerAdvancedGeneric *this,ChVector<double> *mF,ChVector<double> *mT,
          ChVector<double> *mW)

{
  double dVar1;
  double dVar2;
  ChVector<double> local_78;
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  dVar1 = this->mu;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = this->My;
  local_48.m_data[2] = this->Mz;
  Vcross<double,double>(mW,&local_48);
  Vcross<double,double>(mW,&local_60);
  dVar2 = dVar1 * local_78.m_data[2];
  mF->m_data[0] = dVar1 * local_78.m_data[0];
  mF->m_data[1] = dVar1 * local_78.m_data[1];
  mF->m_data[2] = dVar2;
  (*(this->super_ChBeamSectionEuler).super_ChBeamSection._vptr_ChBeamSection[0xc])(this);
  local_60.m_data[0] = dVar2 * mW->m_data[0];
  local_60.m_data[1] = 0.0;
  local_60.m_data[2] = 0.0;
  Vcross<double,double>(mW,&local_60);
  if (&local_78 != mT) {
    mT->m_data[0] = local_78.m_data[0];
    mT->m_data[1] = local_78.m_data[1];
    mT->m_data[2] = local_78.m_data[2];
  }
  return;
}

Assistant:

void ChBeamSectionEulerAdvancedGeneric::ComputeQuadraticTerms(ChVector<>& mF,   ///< centrifugal term (if any) returned here
		ChVector<>& mT,                ///< gyroscopic term  returned here
		const ChVector<>& mW           ///< current angular velocity of section, in material frame
	) {
		// F_centrifugal = density_per_unit_length w X w X c 
		mF = this->mu * Vcross(mW,Vcross(mW,ChVector<>(0,My,Mz)));

		// unroll the product [J] * w  in the expression w X [J] * w  as 8 values of [J] are zero anyway
		mT = Vcross(mW, ChVector<>( this->GetInertiaJxxPerUnitLength()*mW.x(),
									0,
									0 )  );
	}